

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          FieldDescriptorProto *field,FileDescriptorProto *value)

{
  int32_t v;
  ulong uVar1;
  string *psVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  LogMessage local_b8 [19];
  Voidify local_a5 [17];
  int32_t local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_70;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_*>,_bool>
  local_48;
  FileDescriptorProto *local_30;
  FileDescriptorProto *value_local;
  FieldDescriptorProto *field_local;
  string *filename_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_30 = value;
  value_local = (FileDescriptorProto *)field;
  field_local = (FieldDescriptorProto *)filename;
  filename_local = (string *)this;
  FieldDescriptorProto::extendee_abi_cxx11_(field);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)value_local);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
    if (*pcVar3 == '.') {
      psVar2 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)value_local);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)psVar2);
      local_94 = FieldDescriptorProto::number((FieldDescriptorProto *)value_local);
      std::make_pair<std::__cxx11::string,int>(&local_70,&local_90,&local_94);
      absl::lts_20240722::container_internal::
      btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,256,false>>>
      ::emplace<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*&>
                (&local_48,&this->by_extension_,&local_70,&local_30);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      if (((local_48.second ^ 0xffU) & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessage::LogMessage
                  (local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor_database.cc"
                   ,0x105);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_b8);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar4,(char (*) [64])
                                   "Extension conflicts with extension already in database: extend "
                           );
        psVar2 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)value_local);
        pLVar4 = (LogMessage *)
                 absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(string *)psVar2);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar4,(char (*) [4])" { ");
        psVar2 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)value_local);
        pLVar4 = (LogMessage *)
                 absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(string *)psVar2);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar4,(char (*) [4])0x701057);
        v = FieldDescriptorProto::number((FieldDescriptorProto *)value_local);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,v);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar4,(char (*) [9])" } from:");
        pLVar4 = (LogMessage *)
                 absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar4,(string *)field_local);
        absl::lts_20240722::log_internal::Voidify::operator&&(local_a5,pLVar4);
        absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_b8);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!by_extension_
             .emplace(
                 std::make_pair(field.extendee().substr(1), field.number()),
                 value)
             .second) {
      ABSL_LOG(ERROR)
          << "Extension conflicts with extension already in database: "
             "extend "
          << field.extendee() << " { " << field.name() << " = "
          << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}